

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O0

iter_type __thiscall
booster::locale::util::base_num_format<char>::format_time
          (base_num_format<char> *this,iter_type out,ios_base *ios,char_type fill,time_t time,
          string_type *format)

{
  ostreambuf_iterator<char,_std::char_traits<char>_> __result;
  int iVar1;
  fmtflags __a;
  _Ios_Fmtflags _Var2;
  ulong uVar3;
  time_put *ptVar4;
  ios_base *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  long lVar5;
  streambuf_type *psVar6;
  streamsize sVar7;
  long lVar8;
  ostreambuf_iterator<char,_std::char_traits<char>_> *poVar9;
  ios_base *in_RCX;
  undefined1 in_DL;
  undefined1 extraout_DL;
  undefined8 extraout_RDX;
  streambuf_type *in_RSI;
  char in_R8B;
  long in_R9;
  iter_type iVar10;
  fmtflags flags;
  streamsize n;
  streamsize points;
  streamsize on_right;
  streamsize on_left;
  string_type str;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> tmp_out;
  int gmtoff;
  vector<char,_std::allocator<char>_> tmp_buf;
  tm tm;
  string tz;
  ios_info *in_stack_fffffffffffffc48;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  char in_stack_fffffffffffffc5f;
  undefined4 in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  string *in_stack_fffffffffffffc68;
  allocator_type *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  char *in_stack_fffffffffffffc88;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  locale *plVar11;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  string *in_stack_fffffffffffffca8;
  locale local_2b0;
  streambuf_type *local_2a8;
  long local_2a0;
  long local_298;
  string local_290 [32];
  undefined8 local_270;
  undefined1 local_268;
  undefined8 local_260;
  undefined4 local_258;
  locale local_250;
  long local_248 [47];
  int local_d0;
  allocator<char> local_b9 [25];
  tm local_a0;
  string local_68 [32];
  long local_48;
  char local_39;
  ios_base *local_38;
  ostreambuf_iterator<char,_std::char_traits<char>_> local_28;
  streambuf_type *local_18;
  undefined1 uStack_10;
  
  local_48 = in_R9;
  local_39 = in_R8B;
  local_38 = in_RCX;
  local_28._M_sbuf = in_RSI;
  local_28._M_failed = (bool)in_DL;
  ios_info::get((ios_base *)0x28a20d);
  ios_info::time_zone_abi_cxx11_(in_stack_fffffffffffffc48);
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::vector<char,std::allocator<char>>::vector<char_const*,void>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             (char *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
             in_stack_fffffffffffffc78);
  std::allocator<char>::~allocator(local_b9);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_d0 = parse_tz(in_stack_fffffffffffffca8);
    local_48 = local_d0 + local_48;
    gmtime_r(&local_48,&local_a0);
    if (local_d0 != 0) {
      local_a0.tm_zone = std::vector<char,_std::allocator<char>_>::front(in_stack_fffffffffffffc50);
      local_a0.tm_gmtoff = (long)local_d0;
    }
  }
  else {
    localtime_r(&local_48,&local_a0);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
  std::ios_base::getloc((ios_base *)in_stack_fffffffffffffc48);
  ptVar4 = std::use_facet<std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>>
                     (&local_250);
  std::ostreambuf_iterator<char,_std::char_traits<char>_>::ostreambuf_iterator
            ((ostreambuf_iterator<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
             (ostream_type *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
  lVar8 = *(long *)(local_248[0] + -0x18);
  iVar1 = (int)local_39;
  this_00 = (ios_base *)std::__cxx11::string::c_str();
  __first._M_current = (char *)std::__cxx11::string::c_str();
  lVar5 = std::__cxx11::string::size();
  local_270 = std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::put
                        (ptVar4,local_260,local_258,(long)local_248 + lVar8,iVar1,&local_a0,this_00,
                         __first._M_current + lVar5);
  local_268 = extraout_DL;
  std::locale::~locale(&local_250);
  std::__cxx11::ostringstream::str();
  local_298 = 0;
  local_2a0 = 0;
  plVar11 = &local_2b0;
  std::ios_base::getloc(this_00);
  psVar6 = (streambuf_type *)
           formatting_size_traits<char>::size
                     (in_stack_fffffffffffffc68,
                      (locale *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  std::locale::~locale(&local_2b0);
  __last._M_current = (char *)psVar6;
  local_2a8 = psVar6;
  sVar7 = std::ios_base::width(local_38);
  if ((long)psVar6 < sVar7) {
    sVar7 = std::ios_base::width(local_38);
    lVar8 = sVar7 - (long)local_2a8;
    __a = std::ios_base::flags(local_38);
    _Var2 = std::operator&(__a,_S_adjustfield);
    if (_Var2 != _S_left) {
      local_298 = lVar8;
    }
    local_2a0 = lVar8 - local_298;
  }
  for (; 0 < local_298; local_298 = local_298 + -1) {
    poVar9 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator++(&local_28,0);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator*(poVar9);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=
              ((ostreambuf_iterator<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               in_stack_fffffffffffffc5f);
  }
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  __result._8_8_ = plVar11;
  __result._M_sbuf = psVar6;
  std::
  copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::ostreambuf_iterator<char,std::char_traits<char>>>
            (__first,__last,__result);
  for (; 0 < local_2a0; local_2a0 = local_2a0 + -1) {
    in_stack_fffffffffffffc64 = (int)local_39;
    poVar9 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator++(&local_28,0);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator*(poVar9);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=
              ((ostreambuf_iterator<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               in_stack_fffffffffffffc5f);
  }
  std::ios_base::width(local_38,0);
  uStack_10 = local_28._M_failed;
  local_18 = local_28._M_sbuf;
  std::__cxx11::string::~string(local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  std::__cxx11::string::~string(local_68);
  iVar10._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  iVar10._M_failed = (bool)uStack_10;
  iVar10._M_sbuf = local_18;
  return iVar10;
}

Assistant:

iter_type format_time(iter_type out,std::ios_base &ios,char_type fill,std::time_t time,string_type const &format) const
    {
        std::string tz = ios_info::get(ios).time_zone();
        std::tm tm;
        #if defined(__linux) || defined(__FreeBSD__) || defined(__APPLE__) 
        std::vector<char> tmp_buf(tz.c_str(),tz.c_str()+tz.size()+1);
        #endif
        if(tz.empty()) {
            #ifdef BOOSTER_WIN_NATIVE
            /// Windows uses TLS
            tm = *localtime(&time);
            #else
            localtime_r(&time,&tm);
            #endif
        }
        else  {
            int gmtoff = parse_tz(tz);
            time+=gmtoff;
            #ifdef BOOSTER_WIN_NATIVE
            /// Windows uses TLS
            tm = *gmtime(&time);
            #else
            gmtime_r(&time,&tm);
            #endif
            
            #if defined(__linux) || defined(__FreeBSD__) || defined(__APPLE__) 
            // These have extra fields to specify timezone
            if(gmtoff!=0) {
                // bsd and apple want tm_zone be non-const
                tm.tm_zone=&tmp_buf.front();
                tm.tm_gmtoff = gmtoff;
            }
            #endif
        }
        std::basic_ostringstream<char_type> tmp_out;
        std::use_facet<std::time_put<char_type> >(ios.getloc()).put(tmp_out,tmp_out,fill,&tm,format.c_str(),format.c_str()+format.size());
        string_type str = tmp_out.str();
        std::streamsize on_left=0,on_right = 0;
        std::streamsize points = 
            formatting_size_traits<char_type>::size(str,ios.getloc());
        if(points < ios.width()) {
            std::streamsize n = ios.width() - points;
            
            std::ios_base::fmtflags flags = ios.flags() & std::ios_base::adjustfield;
            
            //
            // we do not really know internal point, so we assume that it does not
            // exist. so according to the standard field should be right aligned
            //
            if(flags != std::ios_base::left)
                on_left = n;
            on_right = n - on_left;
        }
        while(on_left > 0) {
            *out++ = fill;
            on_left--;
        }
        std::copy(str.begin(),str.end(),out);
        while(on_right > 0) {
            *out++ = fill;
            on_right--;
        }
        ios.width(0);
        return out;
    }